

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoSimulateBack(Gia_IsoMan_t *p,int Iter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint *puVar11;
  int iVar12;
  long lVar13;
  int *piVar14;
  
  pGVar4 = p->pGia;
  pVVar5 = pGVar4->vCos;
  iVar1 = pVVar5->nSize;
  if (0 < (long)iVar1) {
    piVar14 = pVVar5->pArray;
    lVar10 = 0;
    do {
      lVar13 = (long)piVar14[lVar10];
      if ((lVar13 < 0) || (pGVar4->nObjs <= piVar14[lVar10])) goto LAB_006f5dd1;
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = pGVar4->pObjs + lVar13;
      if (Iter == 0) {
        uVar7 = p->pLevels[lVar13];
        if ((int)uVar7 < 0) goto LAB_006f5e0f;
LAB_006f5bc1:
        iVar12 = (uVar7 + 1) *
                 s_256Primes[((uint)(*(ulong *)pGVar6 >> 0x1d) & 1) + (uVar7 & 0x7f) * 2];
      }
      else {
        uVar7 = p->pUniques[lVar13];
        if (0 < (int)uVar7) goto LAB_006f5bc1;
        iVar12 = 0;
      }
      pGVar6[-(ulong)((uint)*(ulong *)pGVar6 & 0x1fffffff)].Value =
           pGVar6[-(ulong)((uint)*(ulong *)pGVar6 & 0x1fffffff)].Value + iVar12 + pGVar6->Value;
      lVar10 = lVar10 + 1;
    } while (iVar1 != lVar10);
  }
  iVar12 = pGVar4->nObjs;
  lVar10 = (long)iVar12;
  if (1 < lVar10) {
    pGVar6 = pGVar4->pObjs;
    lVar13 = lVar10 + 1;
    puVar11 = &pGVar6[lVar10 + -1].Value;
    do {
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(ulong *)(puVar11 + -2);
      if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
        if (Iter == 0) {
          uVar7 = p->pLevels[lVar13 + -2];
          if ((int)uVar7 < 0) {
LAB_006f5e0f:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
LAB_006f5c7e:
          iVar9 = (uVar7 + 1) * s_256Primes[((uint)(uVar8 >> 0x1d) & 1) + (uVar7 & 0x7f) * 2];
        }
        else {
          uVar7 = p->pUniques[lVar13 + -2];
          if (0 < (int)uVar7) goto LAB_006f5c7e;
          iVar9 = 0;
        }
        piVar14 = (int *)((long)puVar11 + (ulong)(uint)((int)(uVar8 & 0x1fffffff) << 2) * -3);
        *piVar14 = *piVar14 + iVar9 + *puVar11;
        if (Iter == 0) {
          uVar7 = p->pLevels[lVar13 + -2];
          if ((int)uVar7 < 0) goto LAB_006f5e0f;
LAB_006f5ce7:
          iVar9 = (uVar7 + 1) * s_256Primes[((uint)(uVar8 >> 0x3d) & 1) + (uVar7 & 0x7f) * 2];
        }
        else {
          uVar7 = p->pUniques[lVar13 + -2];
          if (0 < (int)uVar7) goto LAB_006f5ce7;
          iVar9 = 0;
        }
        piVar14 = (int *)((long)puVar11 + (ulong)((uint)(uVar8 >> 0x1e) & 0x7ffffffc) * -3);
        *piVar14 = *piVar14 + iVar9 + *puVar11;
      }
      lVar13 = lVar13 + -1;
      puVar11 = puVar11 + -3;
    } while (2 < lVar13);
  }
  iVar9 = pGVar4->nRegs;
  lVar10 = (long)iVar9;
  if (0 < lVar10) {
    uVar8 = (ulong)(uint)(iVar1 - iVar9);
    iVar9 = -iVar9;
LAB_006f5d4c:
    if ((iVar1 + iVar9 < 0) || (iVar1 <= iVar1 + iVar9)) {
LAB_006f5df0:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = pVVar5->pArray[uVar8];
    if (((long)iVar2 < 0) || (iVar12 <= iVar2)) {
LAB_006f5dd1:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar6 = pGVar4->pObjs;
    if (pGVar6 != (Gia_Obj_t *)0x0) {
      iVar3 = pGVar4->vCis->nSize;
      uVar7 = iVar9 + iVar3;
      if (((int)uVar7 < 0) || (iVar3 <= (int)uVar7)) goto LAB_006f5df0;
      iVar3 = pGVar4->vCis->pArray[uVar7];
      if (((long)iVar3 < 0) || (iVar12 <= iVar3)) goto LAB_006f5dd1;
      pGVar6[iVar2].Value = pGVar6[iVar2].Value + pGVar6[iVar3].Value;
      iVar9 = iVar9 + 1;
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + -1;
      if (lVar10 != 0) goto LAB_006f5d4c;
    }
  }
  return;
}

Assistant:

void Gia_IsoSimulateBack( Gia_IsoMan_t * p, int Iter )
{
    Gia_Obj_t * pObj, * pObjF;
    int i, iObj;
    // simulate COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        Gia_ObjFanin0(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, iObj, Gia_ObjFaninC0(pObj));
    }
    // simulate objects
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        Gia_ObjFanin0(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, i, Gia_ObjFaninC0(pObj));
        Gia_ObjFanin1(pObj)->Value += pObj->Value + Gia_IsoUpdate(p, Iter, i, Gia_ObjFaninC1(pObj));
    }
    // transfer flop values
    Gia_ManForEachRiRo( p->pGia, pObjF, pObj, i )
        pObjF->Value += pObj->Value;
}